

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O3

value_type_conflict7 * __thiscall
poplar::compact_bonsai_nlm<int,_8UL>::insert
          (compact_bonsai_nlm<int,_8UL> *this,uint64_t pos,char_range *key)

{
  byte *pbVar1;
  pointer puVar2;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar3;
  bool bVar4;
  unsigned_long uVar5;
  long lVar6;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var7;
  uint uVar8;
  uint8_t *puVar9;
  ulong uVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  uint8_t *puVar13;
  ulong chunk_id;
  uint8_t *puVar14;
  uint8_t *puVar15;
  value_type_conflict7 *pvVar16;
  pair<unsigned_long,_unsigned_long> pVar17;
  
  uVar8 = (uint)pos & 7;
  chunk_id = pos >> 3;
  pbVar1 = (this->chunks_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start + chunk_id;
  *pbVar1 = *pbVar1 | '\x01' << (sbyte)uVar8;
  this->size_ = this->size_ + 1;
  puVar2 = (this->ptrs_).
           super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(long *)((long)&(puVar2->_M_t).
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> +
               (pos & 0xfffffffffffffff8)) == 0) {
    puVar13 = key->end;
    lVar6 = 1;
    if (key->begin == puVar13) {
      puVar15 = (uint8_t *)0x4;
      bVar4 = false;
      puVar13 = (uint8_t *)0x0;
    }
    else {
      uVar10 = ~(ulong)key->begin;
      puVar15 = puVar13 + uVar10 + 4;
      puVar13 = puVar13 + uVar10;
      puVar14 = puVar15;
      if (puVar15 < (uint8_t *)0x80) {
        bVar4 = false;
      }
      else {
        do {
          lVar6 = lVar6 + 1;
          bVar4 = (uint8_t *)0x3fff < puVar14;
          puVar14 = (uint8_t *)((ulong)puVar14 >> 7);
        } while (bVar4);
        bVar4 = true;
      }
    }
    puVar14 = puVar13 + lVar6 + 4;
    this->label_bytes_ = (uint64_t)(puVar14 + this->label_bytes_);
    _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__((ulong)puVar14);
    lVar6 = 0;
    memset((void *)_Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,(size_t)puVar14);
    puVar2[chunk_id]._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
         _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (this->ptrs_).
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[chunk_id]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    if (bVar4) {
      lVar6 = 0;
      puVar14 = puVar15;
      do {
        puVar15 = (uint8_t *)((ulong)puVar14 >> 7);
        *(byte *)((long)_Var7.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar6) =
             (byte)puVar14 | 0x80;
        lVar6 = lVar6 + 1;
        bVar4 = (uint8_t *)0x3fff < puVar14;
        puVar14 = puVar15;
      } while (bVar4);
    }
    lVar6 = (long)_Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1 + lVar6;
    *(char *)(lVar6 + -1) = (char)puVar15;
    if (puVar13 != (uint8_t *)0x0) {
      puVar14 = (uint8_t *)0x0;
      puVar15 = key->begin;
      do {
        puVar14[lVar6] = puVar14[(long)puVar15];
        puVar14 = puVar14 + 1;
      } while (puVar13 != puVar14);
    }
    pvVar16 = (value_type_conflict7 *)(puVar13 + lVar6);
    puVar13 = puVar13 + lVar6;
    puVar13[0] = '\0';
    puVar13[1] = '\0';
    puVar13[2] = '\0';
    puVar13[3] = '\0';
  }
  else {
    pVar17 = get_allocs_(this,chunk_id,(ulong)uVar8);
    uVar12 = pVar17.second;
    uVar5 = pVar17.first;
    puVar15 = key->begin;
    puVar13 = key->end;
    lVar6 = 1;
    if (puVar15 == puVar13) {
      puVar14 = (uint8_t *)0x4;
      bVar4 = false;
      puVar13 = (uint8_t *)0x0;
    }
    else {
      puVar14 = puVar13 + ~(ulong)puVar15 + 4;
      puVar13 = puVar13 + ~(ulong)puVar15;
      puVar9 = puVar14;
      if (puVar14 < (uint8_t *)0x80) {
        bVar4 = false;
      }
      else {
        do {
          lVar6 = lVar6 + 1;
          bVar4 = (uint8_t *)0x3fff < puVar9;
          puVar9 = (uint8_t *)((ulong)puVar9 >> 7);
        } while (bVar4);
        bVar4 = true;
      }
    }
    this->label_bytes_ = (uint64_t)(puVar13 + this->label_bytes_ + lVar6 + 4);
    _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__((ulong)(puVar13 + uVar12 + uVar5 + lVar6 + 4));
    memset((void *)_Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,
           (size_t)(puVar13 + uVar12 + uVar5 + lVar6 + 4));
    puVar2 = (this->ptrs_).
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
          &puVar2[chunk_id]._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    if (uVar5 != 0) {
      uVar11 = 0;
      do {
        *(undefined1 *)
         ((long)_Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar11) =
             *(undefined1 *)
              ((long)tVar3.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar11);
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
    if (bVar4) {
      lVar6 = 0;
      puVar9 = puVar14;
      do {
        puVar14 = (uint8_t *)((ulong)puVar9 >> 7);
        *(byte *)((long)_Var7.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar6 + uVar5)
             = (byte)puVar9 | 0x80;
        lVar6 = lVar6 + 1;
        bVar4 = (uint8_t *)0x3fff < puVar9;
        puVar9 = puVar14;
      } while (bVar4);
    }
    else {
      lVar6 = 0;
    }
    lVar6 = (long)_Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar6 + uVar5 + 1;
    *(char *)(lVar6 + -1) = (char)puVar14;
    if (puVar13 != (uint8_t *)0x0) {
      puVar14 = (uint8_t *)0x0;
      do {
        puVar14[lVar6] = puVar15[(long)puVar14];
        puVar14 = puVar14 + 1;
      } while (puVar13 != puVar14);
    }
    pvVar16 = (value_type_conflict7 *)(puVar13 + lVar6);
    puVar13 = puVar13 + lVar6;
    puVar13[0] = '\0';
    puVar13[1] = '\0';
    puVar13[2] = '\0';
    puVar13[3] = '\0';
    if (uVar12 == 0) {
      puVar2[chunk_id]._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
           _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      if (tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
          (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
        return pvVar16;
      }
    }
    else {
      uVar11 = 0;
      do {
        *(undefined1 *)((long)pvVar16 + uVar11 + 4) =
             *(undefined1 *)
              ((long)tVar3.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar11 + uVar5);
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
      puVar2[chunk_id]._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
           _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
    operator_delete__((void *)tVar3.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  return pvVar16;
}

Assistant:

value_type* insert(uint64_t pos, const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(!bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));
        bit_tools::set_bit(chunks_[chunk_id], pos_in_chunk);

        ++size_;

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        if (!ptrs_[chunk_id]) {
            // First association in the group
            uint64_t length = key.empty() ? 0 : key.length() - 1;
            uint64_t new_alloc = vbyte::size(length + sizeof(value_type)) + length + sizeof(value_type);
            label_bytes_ += new_alloc;

            ptrs_[chunk_id] = std::make_unique<uint8_t[]>(new_alloc);
            uint8_t* ptr = ptrs_[chunk_id].get();

            ptr += vbyte::encode(ptr, length + sizeof(value_type));
            copy_bytes(ptr, key.begin, length);

            auto ret_ptr = reinterpret_cast<value_type*>(ptr + length);
            *ret_ptr = static_cast<value_type>(0);

            return ret_ptr;
        }

        // Second and subsequent association in the group
        auto fr_alloc = get_allocs_(chunk_id, pos_in_chunk);

        const uint64_t len = key.empty() ? 0 : key.length() - 1;
        const uint64_t new_alloc = vbyte::size(len + sizeof(value_type)) + len + sizeof(value_type);
        label_bytes_ += new_alloc;

        auto new_unique = std::make_unique<uint8_t[]>(fr_alloc.first + new_alloc + fr_alloc.second);

        // Get raw pointers
        const uint8_t* orig_ptr = ptrs_[chunk_id].get();
        uint8_t* new_ptr = new_unique.get();

        // Copy the front allocation
        copy_bytes(new_ptr, orig_ptr, fr_alloc.first);
        orig_ptr += fr_alloc.first;
        new_ptr += fr_alloc.first;

        // Set new allocation
        new_ptr += vbyte::encode(new_ptr, len + sizeof(value_type));
        copy_bytes(new_ptr, key.begin, len);
        new_ptr += len;
        *reinterpret_cast<value_type*>(new_ptr) = static_cast<value_type>(0);

        // Copy the back allocation
        copy_bytes(new_ptr + sizeof(value_type), orig_ptr, fr_alloc.second);

        // Overwrite
        ptrs_[chunk_id] = std::move(new_unique);

        return reinterpret_cast<value_type*>(new_ptr);
    }